

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  uint uVar1;
  int iVar2;
  TValue *in_RDX;
  TValue *in_RSI;
  lua_State *in_RDI;
  int res;
  TString *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI->tt == in_RDX->tt) {
    if (in_RSI->tt == 3) {
      uVar1 = (uint)((in_RSI->value).n < (in_RDX->value).n);
    }
    else if (in_RSI->tt == 4) {
      iVar2 = l_strcmp((TString *)r,unaff_retaddr);
      uVar1 = (uint)(iVar2 < 0);
    }
    else {
      uVar1 = call_orderTM((lua_State *)r,(TValue *)&unaff_retaddr->tsv,
                           (TValue *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (TMS)((ulong)in_RDI >> 0x20));
      if (uVar1 == 0xffffffff) {
        uVar1 = luaG_ordererror(in_RDI,in_RSI,in_RDX);
      }
    }
  }
  else {
    uVar1 = luaG_ordererror(in_RDI,in_RSI,in_RDX);
  }
  return uVar1;
}

Assistant:

static int luaV_lessthan(lua_State*L,const TValue*l,const TValue*r){
int res;
if(ttype(l)!=ttype(r))
return luaG_ordererror(L,l,r);
else if(ttisnumber(l))
return luai_numlt(nvalue(l),nvalue(r));
else if(ttisstring(l))
return l_strcmp(rawtsvalue(l),rawtsvalue(r))<0;
else if((res=call_orderTM(L,l,r,TM_LT))!=-1)
return res;
return luaG_ordererror(L,l,r);
}